

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn.c
# Opt level: O0

void bignum_rshift(bn *a,bn *b,int nbits)

{
  long lVar1;
  int iVar2;
  byte bVar3;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int i;
  int nwords;
  int nbits_pr_word;
  bn *in_stack_ffffffffffffffc8;
  bn *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int local_1c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI == 0) {
    __assert_fail("a && \"\\\"a is null\\\"\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/nequ4tion[P]cpwntools/cpwn_extern/tiny-bignum-c/bn.c"
                  ,0x160,"void bignum_rshift(struct bn *, struct bn *, int)");
  }
  if (in_RSI == 0) {
    __assert_fail("b && \"\\\"b is null\\\"\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/nequ4tion[P]cpwntools/cpwn_extern/tiny-bignum-c/bn.c"
                  ,0x161,"void bignum_rshift(struct bn *, struct bn *, int)");
  }
  if (in_EDX < 0) {
    __assert_fail("nbits >= 0 && \"\\\"no negative shifts\\\"\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/nequ4tion[P]cpwntools/cpwn_extern/tiny-bignum-c/bn.c"
                  ,0x162,"void bignum_rshift(struct bn *, struct bn *, int)");
  }
  bignum_assign((bn *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                in_stack_ffffffffffffffd0);
  iVar2 = in_EDX / 0x20;
  local_1c = in_EDX;
  if (iVar2 != 0) {
    _rshift_word(in_stack_ffffffffffffffc8,0);
    local_1c = in_EDX + iVar2 * -0x20;
  }
  if (local_1c != 0) {
    for (iVar2 = 0; bVar3 = (byte)local_1c, iVar2 < 0x1f; iVar2 = iVar2 + 1) {
      *(uint *)(in_RSI + (long)iVar2 * 4) =
           *(uint *)(in_RSI + (long)iVar2 * 4) >> (bVar3 & 0x1f) |
           *(int *)(in_RSI + (long)(iVar2 + 1) * 4) << (0x20 - bVar3 & 0x1f);
    }
    *(uint *)(in_RSI + (long)iVar2 * 4) = *(uint *)(in_RSI + (long)iVar2 * 4) >> (bVar3 & 0x1f);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void bignum_rshift(struct bn* a, struct bn* b, int nbits)
{
  require(a, "a is null");
  require(b, "b is null");
  require(nbits >= 0, "no negative shifts");
  
  bignum_assign(b, a);
  /* Handle shift in multiples of word-size */
  const int nbits_pr_word = (WORD_SIZE * 8);
  int nwords = nbits / nbits_pr_word;
  if (nwords != 0)
  {
    _rshift_word(b, nwords);
    nbits -= (nwords * nbits_pr_word);
  }

  if (nbits != 0)
  {
    int i;
    for (i = 0; i < (BN_ARRAY_SIZE - 1); ++i)
    {
      b->array[i] = (b->array[i] >> nbits) | (b->array[i + 1] << ((8 * WORD_SIZE) - nbits));
    }
    b->array[i] >>= nbits;
  }
  
}